

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar3;
  undefined4 extraout_var_01;
  LogFinisher local_59;
  LogMessage local_58;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0x15])(from);
  if (CONCAT44(extraout_var_00,iVar2) != CONCAT44(extraout_var,iVar1)) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x53);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (from.GetDescriptor()) == (descriptor): ");
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,": Tried to merge from a message with a different type.  to: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(CONCAT44(extraout_var,iVar1) + 8))
    ;
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", from: ");
    iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x15])(from);
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,*(string **)(CONCAT44(extraout_var_01,iVar1) + 8));
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::ReflectionOps::Merge(from,this);
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  const Descriptor* descriptor = GetDescriptor();
  GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
      << ": Tried to merge from a message with a different type.  "
         "to: "
      << descriptor->full_name()
      << ", "
         "from: "
      << from.GetDescriptor()->full_name();
  ReflectionOps::Merge(from, this);
}